

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::FboTestUtil::TextureCubeShader::TextureCubeShader
          (TextureCubeShader *this,DataType samplerType,DataType outputType)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ShaderProgramDeclaration *pSVar4;
  long *plVar5;
  undefined1 *puVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  bool bVar13;
  undefined4 uVar14;
  long *local_460;
  long local_458;
  long local_450;
  long lStack_448;
  long *local_440;
  long local_438;
  long local_430;
  long lStack_428;
  long *local_420;
  long local_418;
  long local_410;
  long lStack_408;
  long *local_400;
  long local_3f8;
  long local_3f0;
  long lStack_3e8;
  long *local_3e0;
  long local_3d8;
  long local_3d0;
  long lStack_3c8;
  long *local_3c0;
  long local_3b8;
  long local_3b0 [2];
  long *local_3a0;
  long local_398;
  long local_390 [2];
  long *local_380;
  long local_378;
  long local_370 [2];
  long *local_360;
  long local_358;
  long local_350 [2];
  long *local_340;
  long local_338;
  long local_330 [2];
  long *local_320;
  long local_318;
  long local_310 [2];
  long *local_300;
  long local_2f8;
  long local_2f0 [2];
  long *local_2e0 [2];
  long local_2d0 [2];
  long *local_2c0;
  long local_2b8;
  long local_2b0;
  long lStack_2a8;
  VertexSource local_2a0;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  FragmentOutput local_25c;
  Uniform local_258;
  Uniform local_230;
  Uniform local_208;
  Uniform local_1e0;
  VertexAttribute local_1b8;
  VertexAttribute local_190;
  FragmentSource local_168;
  VertexToFragmentVarying local_148;
  ShaderProgramDeclaration local_140;
  long lVar12;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_140);
  local_300 = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"a_position","");
  local_190.name._M_dataplus._M_p = (pointer)&local_190.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_300,local_2f8 + (long)local_300);
  local_190.type = GENERICVECTYPE_FLOAT;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_140,&local_190);
  local_320 = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"a_coord","");
  local_1b8.name._M_dataplus._M_p = (pointer)&local_1b8.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_320,local_318 + (long)local_320);
  local_1b8.type = GENERICVECTYPE_FLOAT;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_1b8);
  local_148.type = GENERICVECTYPE_FLOAT;
  local_148.flatshade = false;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_148);
  if (outputType == TYPE_FLOAT_VEC4) {
    local_25c.type = GENERICVECTYPE_FLOAT;
  }
  else if (outputType == TYPE_UINT_VEC4) {
    local_25c.type = GENERICVECTYPE_UINT32;
  }
  else if (outputType == TYPE_INT_VEC4) {
    local_25c.type = GENERICVECTYPE_INT32;
  }
  else {
    local_25c.type = GENERICVECTYPE_LAST;
  }
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_25c);
  local_340 = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"u_coordMat","");
  local_1e0.name._M_dataplus._M_p = (pointer)&local_1e0.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,local_340,local_338 + (long)local_340);
  local_1e0.type = TYPE_FLOAT_MAT3;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_1e0);
  local_360 = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"u_sampler0","");
  local_208.name._M_dataplus._M_p = (pointer)&local_208.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_360,local_358 + (long)local_360);
  local_208.type = samplerType;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_208);
  local_380 = local_370;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"u_scale","");
  local_230.name._M_dataplus._M_p = (pointer)&local_230.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,local_380,local_378 + (long)local_380);
  local_230.type = TYPE_FLOAT_VEC4;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_230);
  local_3a0 = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"u_bias","");
  local_258.name._M_dataplus._M_p = (pointer)&local_258.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_3a0,local_398 + (long)local_3a0);
  local_258.type = TYPE_FLOAT_VEC4;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_258);
  local_3c0 = local_3b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3c0,
             "#version 300 es\nin highp vec4 a_position;\nin mediump vec2 a_coord;\nuniform mat3 u_coordMat;\nout mediump vec3 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = u_coordMat * vec3(a_coord, 1.0);\n}\n"
             ,"");
  local_2a0.source._M_dataplus._M_p = (pointer)&local_2a0.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2a0,local_3c0,local_3b8 + (long)local_3c0);
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_2a0);
  local_2e0[0] = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,0x1af8059);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_2e0);
  local_460 = &local_450;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_450 = *plVar7;
    lStack_448 = plVar5[3];
  }
  else {
    local_450 = *plVar7;
    local_460 = (long *)*plVar5;
  }
  local_458 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  glu::getDataTypeName(samplerType);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_460);
  local_420 = &local_410;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_410 = *plVar7;
    lStack_408 = plVar5[3];
  }
  else {
    local_410 = *plVar7;
    local_420 = (long *)*plVar5;
  }
  local_418 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_420);
  local_440 = &local_430;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_430 = *plVar7;
    lStack_428 = plVar5[3];
  }
  else {
    local_430 = *plVar7;
    local_440 = (long *)*plVar5;
  }
  local_438 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  glu::getDataTypeName(outputType);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_440);
  local_400 = &local_3f0;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_3f0 = *plVar7;
    lStack_3e8 = plVar5[3];
  }
  else {
    local_3f0 = *plVar7;
    local_400 = (long *)*plVar5;
  }
  local_3f8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_400);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_2b0 = *plVar7;
    lStack_2a8 = plVar5[3];
    local_2c0 = &local_2b0;
  }
  else {
    local_2b0 = *plVar7;
    local_2c0 = (long *)*plVar5;
  }
  local_2b8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  glu::getDataTypeName(outputType);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2c0);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_270 = *plVar7;
    lStack_268 = plVar5[3];
    local_280 = &local_270;
  }
  else {
    local_270 = *plVar7;
    local_280 = (long *)*plVar5;
  }
  local_278 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_280);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_3d0 = *plVar7;
    lStack_3c8 = plVar5[3];
    local_3e0 = &local_3d0;
  }
  else {
    local_3d0 = *plVar7;
    local_3e0 = (long *)*plVar5;
  }
  local_3d8 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  paVar1 = &local_168.source.field_2;
  local_168.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,local_3e0,local_3d8 + (long)local_3e0);
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_168);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.source._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.source._M_dataplus._M_p,
                    local_168.source.field_2._M_allocated_capacity + 1);
  }
  if (local_3e0 != &local_3d0) {
    operator_delete(local_3e0,local_3d0 + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,local_270 + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,local_2b0 + 1);
  }
  if (local_400 != &local_3f0) {
    operator_delete(local_400,local_3f0 + 1);
  }
  if (local_440 != &local_430) {
    operator_delete(local_440,local_430 + 1);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420,local_410 + 1);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  if (local_2e0[0] != local_2d0) {
    operator_delete(local_2e0[0],local_2d0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.source._M_dataplus._M_p != &local_2a0.source.field_2) {
    operator_delete(local_2a0.source._M_dataplus._M_p,
                    local_2a0.source.field_2._M_allocated_capacity + 1);
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0,local_3b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.name._M_dataplus._M_p != &local_258.name.field_2) {
    operator_delete(local_258.name._M_dataplus._M_p,local_258.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0,local_390[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.name._M_dataplus._M_p != &local_230.name.field_2) {
    operator_delete(local_230.name._M_dataplus._M_p,local_230.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_380 != local_370) {
    operator_delete(local_380,local_370[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.name._M_dataplus._M_p != &local_208.name.field_2) {
    operator_delete(local_208.name._M_dataplus._M_p,local_208.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.name._M_dataplus._M_p != &local_1e0.name.field_2) {
    operator_delete(local_1e0.name._M_dataplus._M_p,local_1e0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8.name._M_dataplus._M_p != &local_1b8.name.field_2) {
    operator_delete(local_1b8.name._M_dataplus._M_p,local_1b8.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_320 != local_310) {
    operator_delete(local_320,local_310[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.name._M_dataplus._M_p != &local_190.name.field_2) {
    operator_delete(local_190.name._M_dataplus._M_p,local_190.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_300 != local_2f0) {
    operator_delete(local_300,local_2f0[0] + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_140);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_02154fa8;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_02154fe0;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_02154ff8;
  *(undefined8 *)&(this->super_ShaderProgram).field_0x154 = 0;
  *(undefined8 *)&this->field_0x15c = 0;
  *(undefined8 *)&this->field_0x164 = 0;
  *(undefined8 *)&this->field_0x16c = 0;
  *(undefined4 *)&this->field_0x174 = 0;
  auVar3 = _DAT_019fcc00;
  auVar2 = _DAT_019f5ce0;
  puVar6 = &this->field_0x160;
  lVar8 = 0;
  lVar9 = 0;
  do {
    lVar10 = 0;
    auVar11 = auVar3;
    do {
      bVar13 = SUB164(auVar11 ^ auVar2,4) == -0x80000000 && SUB164(auVar11 ^ auVar2,0) < -0x7ffffffd
      ;
      if (bVar13) {
        uVar14 = 0x3f800000;
        if (lVar8 != lVar10) {
          uVar14 = 0;
        }
        *(undefined4 *)(puVar6 + lVar10 + -0xc) = uVar14;
      }
      if (bVar13) {
        uVar14 = 0x3f800000;
        if (lVar8 + -0xc != lVar10) {
          uVar14 = 0;
        }
        *(undefined4 *)(puVar6 + lVar10) = uVar14;
      }
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar12 + 2;
      lVar10 = lVar10 + 0x18;
    } while (lVar10 != 0x30);
    lVar9 = lVar9 + 1;
    lVar8 = lVar8 + 0xc;
    puVar6 = puVar6 + 4;
  } while (lVar9 != 3);
  (this->m_texScale).m_data[0] = 1.0;
  (this->m_texScale).m_data[1] = 1.0;
  (this->m_texScale).m_data[2] = 1.0;
  (this->m_texScale).m_data[3] = 1.0;
  (this->m_texBias).m_data[0] = 0.0;
  (this->m_texBias).m_data[1] = 0.0;
  (this->m_texBias).m_data[2] = 0.0;
  (this->m_texBias).m_data[3] = 0.0;
  this->m_outputType = outputType;
  return;
}

Assistant:

TextureCubeShader::TextureCubeShader (glu::DataType samplerType, glu::DataType outputType)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType))
							<< sglr::pdec::Uniform("u_coordMat", glu::TYPE_FLOAT_MAT3)
							<< sglr::pdec::Uniform("u_sampler0", samplerType)
							<< sglr::pdec::Uniform("u_scale", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::Uniform("u_bias", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::VertexSource(
									"#version 300 es\n"
									"in highp vec4 a_position;\n"
									"in mediump vec2 a_coord;\n"
									"uniform mat3 u_coordMat;\n"
									"out mediump vec3 v_coord;\n"
									"void main (void)\n"
									"{\n"
									"	gl_Position = a_position;\n"
									"	v_coord = u_coordMat * vec3(a_coord, 1.0);\n"
									"}\n")
							<< sglr::pdec::FragmentSource(
									string("") +
									"#version 300 es\n"
									"uniform highp " + glu::getDataTypeName(samplerType) + " u_sampler0;\n"
									"uniform highp vec4 u_scale;\n"
									"uniform highp vec4 u_bias;\n"
									"in mediump vec3 v_coord;\n"
									"layout(location = 0) out highp " + glu::getDataTypeName(outputType) + " o_color;\n"
									"void main (void)\n"
									"{\n"
									"	o_color = " + glu::getDataTypeName(outputType) + "(vec4(texture(u_sampler0, v_coord)) * u_scale + u_bias);\n"
									"}\n"))
	, m_texScale	(1.0f)
	, m_texBias		(0.0f)
	, m_outputType	(outputType)
{
}